

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::
StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  bool bVar1;
  StandardWriterPageState<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
  *pSVar2;
  TemplatedValidityMask<unsigned_long> *this_00;
  InternalException *this_01;
  ColumnWriterStatistics *in_RDX;
  BssEncoder *in_RDI;
  ulong in_R9;
  ParquetIntervalTargetType PVar3;
  ulong in_stack_00000008;
  ParquetIntervalTargetType target_value_4;
  idx_t r_3;
  ParquetIntervalTargetType target_value_3;
  ParquetIntervalTargetType target_value_2;
  idx_t r_2;
  ParquetIntervalTargetType target_value_1;
  ParquetIntervalTargetType target_value;
  idx_t r_1;
  uint32_t value_index;
  interval_t *src_value;
  idx_t r;
  interval_t *data_ptr;
  ValidityMask *mask;
  StandardWriterPageState<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
  *page_state;
  WriteStream *in_stack_00005dd8;
  ValidityMask *in_stack_00005de0;
  idx_t in_stack_00005de8;
  idx_t in_stack_00005df0;
  ColumnWriterStatistics *in_stack_00005df8;
  Vector *in_stack_00005e00;
  undefined7 in_stack_fffffffffffffd78;
  uchar in_stack_fffffffffffffd7f;
  ClientContext *in_stack_fffffffffffffd80;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffd88;
  allocator *paVar4;
  RleBpEncoder *in_stack_fffffffffffffd90;
  Allocator *in_stack_fffffffffffffd98;
  ParquetIntervalTargetType *in_stack_fffffffffffffdb8;
  ParquetIntervalTargetType *in_stack_fffffffffffffdc0;
  Allocator *in_stack_fffffffffffffdc8;
  DlbaEncoder *in_stack_fffffffffffffdd0;
  interval_t in_stack_fffffffffffffdd8;
  ulong local_1c0;
  ulong local_110;
  ulong local_68;
  ulong local_50;
  
  pSVar2 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator>>
                     ((ColumnWriterPageState *)in_stack_fffffffffffffd80);
  this_00 = &FlatVector::Validity((Vector *)0x231d59e)->super_TemplatedValidityMask<unsigned_long>;
  FlatVector::GetData<duckdb::interval_t>((Vector *)0x231d5b3);
  switch(pSVar2->encoding) {
  case PLAIN:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(this_00);
    if (bVar1) {
      TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,true>
                (in_stack_00005e00,in_stack_00005df8,in_stack_00005df0,in_stack_00005de8,
                 in_stack_00005de0,in_stack_00005dd8);
    }
    else {
      TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,false>
                (in_stack_00005e00,in_stack_00005df8,in_stack_00005df0,in_stack_00005de8,
                 in_stack_00005de0,in_stack_00005dd8);
    }
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar4 = (allocator *)&stack0xfffffffffffffdc7;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffdc8,"Unknown encoding",paVar4);
    InternalException::InternalException
              (this_01,(string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
  case DELTA_BINARY_PACKED:
    local_68 = in_R9;
    if ((pSVar2->dbp_initialized & 1U) == 0) {
      for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd88,(idx_t)in_stack_fffffffffffffd80);
        if (bVar1) {
          PVar3 = ParquetIntervalOperator::
                  Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                            (in_stack_fffffffffffffdd8);
          BaseParquetOperator::HandleStats<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                    (in_RDX,PVar3);
          DbpEncoder::BeginWrite<duckdb::ParquetIntervalTargetType>
                    (&in_stack_fffffffffffffdd0->dbp_encoder,
                     (WriteStream *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
          pSVar2->dbp_initialized = true;
          local_68 = local_68 + 1;
          break;
        }
      }
    }
    for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      PVar3 = ParquetIntervalOperator::
              Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                        (in_stack_fffffffffffffdd8);
      BaseParquetOperator::HandleStats<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                (in_RDX,PVar3);
      DbpEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                (&in_stack_fffffffffffffdd0->dbp_encoder,(WriteStream *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
    }
    break;
  case DELTA_LENGTH_BYTE_ARRAY:
    local_110 = in_R9;
    if ((pSVar2->dlba_initialized & 1U) == 0) {
      for (; local_110 < in_stack_00000008; local_110 = local_110 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd88,(idx_t)in_stack_fffffffffffffd80);
        if (bVar1) {
          PVar3 = ParquetIntervalOperator::
                  Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                            (in_stack_fffffffffffffdd8);
          BaseParquetOperator::HandleStats<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                    (in_RDX,PVar3);
          ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
          BufferAllocator::Get(in_stack_fffffffffffffd80);
          DlbaEncoder::BeginWrite<duckdb::ParquetIntervalTargetType>
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (WriteStream *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          pSVar2->dlba_initialized = true;
          local_110 = local_110 + 1;
          break;
        }
      }
    }
    for (; local_110 < in_stack_00000008; local_110 = local_110 + 1) {
      PVar3 = ParquetIntervalOperator::
              Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                        (in_stack_fffffffffffffdd8);
      BaseParquetOperator::HandleStats<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                (in_RDX,PVar3);
      DlbaEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                (in_stack_fffffffffffffdd0,(WriteStream *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
    }
    break;
  case RLE_DICTIONARY:
    local_50 = in_R9;
    if ((pSVar2->dict_written_value & 1U) == 0) {
      for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd88,(idx_t)in_stack_fffffffffffffd80);
        if (bVar1) {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7f);
          RleBpEncoder::BeginWrite(&pSVar2->dict_encoder);
          pSVar2->dict_written_value = true;
          break;
        }
      }
    }
    for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
      PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
      ::GetIndex((PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
                  *)in_stack_fffffffffffffd80,
                 (interval_t *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      RleBpEncoder::WriteValue
                (in_stack_fffffffffffffd90,(WriteStream *)in_stack_fffffffffffffd88,
                 (uint32_t *)in_stack_fffffffffffffd80);
    }
    break;
  case BYTE_STREAM_SPLIT:
    local_1c0 = in_R9;
    if ((pSVar2->bss_initialized & 1U) != 0) {
      in_stack_fffffffffffffd90 = (RleBpEncoder *)&pSVar2->bss_encoder;
      ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
      BufferAllocator::Get(in_stack_fffffffffffffd80);
      BssEncoder::BeginWrite(in_RDI,in_stack_fffffffffffffd98);
      pSVar2->bss_initialized = true;
    }
    for (; local_1c0 < in_stack_00000008; local_1c0 = local_1c0 + 1) {
      PVar3 = ParquetIntervalOperator::
              Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                        (in_stack_fffffffffffffdd8);
      BaseParquetOperator::HandleStats<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                (in_RDX,PVar3);
      BssEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                ((BssEncoder *)in_stack_fffffffffffffd90,
                 (ParquetIntervalTargetType *)in_stack_fffffffffffffd88);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}